

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateBuilderMembers
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  JavaType JVar1;
  FieldDescriptor *field;
  char *text;
  char *text_00;
  char *local_38;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.MapField<\n    $type_parameters$> $name$_;\nprivate com.google.protobuf.MapField<$type_parameters$>\ninternalGet$capitalized_name$() {\n  if ($name$_ == null) {\n    return com.google.protobuf.MapField.emptyMapField(\n        $map_field_parameter$);\n  }\n  return $name$_;\n}\nprivate com.google.protobuf.MapField<$type_parameters$>\ninternalGetMutable$capitalized_name$() {\n  $on_changed$;\n  if ($name$_ == null) {\n    $name$_ = com.google.protobuf.MapField.newMapField(\n        $map_field_parameter$);\n  }\n  if (!$name$_.isMutable()) {\n    $name$_ = $name$_.copy();\n  }\n  return $name$_;\n}\n"
                    );
  GenerateMapGetters(this,printer);
  io::Printer::Print(printer,variables,
                     "$deprecation$\npublic Builder ${$clear$capitalized_name$$}$() {\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .clear();\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$\npublic Builder ${$remove$capitalized_name$$}$(\n    $key_type$ key) {\n  $key_null_check$\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .remove(key);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  field = anon_unknown_5::ValueField(this->descriptor_);
  JVar1 = GetJavaType(field);
  if (JVar1 == JAVATYPE_ENUM) {
    io::Printer::Print(printer,variables,
                       "/**\n * Use alternate mutation accessors instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$getMutable$capitalized_name$$}$() {\n  return internalGetAdapted$capitalized_name$Map(\n       internalGetMutable$capitalized_name$().getMutableMap());\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$public Builder ${$put$capitalized_name$$}$(\n    $key_type$ key,\n    $value_enum_type$ value) {\n  $key_null_check$\n  $value_null_check$\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .put(key, $name$ValueConverter.doBackward(value));\n  return this;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n    java.util.Map<$boxed_key_type$, $value_enum_type$> values) {\n  internalGetAdapted$capitalized_name$Map(\n      internalGetMutable$capitalized_name$().getMutableMap())\n          .putAll(values);\n  return this;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    if (*(char *)(*(long *)(this->descriptor_ + 0x10) + 0x3a) != '\x03') {
      return;
    }
    local_38 = 
    "$deprecation$public Builder ${$putAll$capitalized_name$Value$}$(\n    java.util.Map<$boxed_key_type$, $boxed_value_type$> values) {\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .putAll(values);\n  return this;\n}\n"
    ;
    text_00 = 
    "$deprecation$public Builder ${$put$capitalized_name$Value$}$(\n    $key_type$ key,\n    $value_type$ value) {\n  $key_null_check$\n  $value_null_check$\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .put(key, value);\n  return this;\n}\n"
    ;
    text = 
    "/**\n * Use alternate mutation accessors instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\n${$getMutable$capitalized_name$Value$}$() {\n  return internalGetMutable$capitalized_name$().getMutableMap();\n}\n"
    ;
  }
  else {
    local_38 = 
    "$deprecation$\npublic Builder ${$putAll$capitalized_name$$}$(\n    java.util.Map<$type_parameters$> values) {\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .putAll(values);\n  return this;\n}\n"
    ;
    text_00 = 
    "$deprecation$public Builder ${$put$capitalized_name$$}$(\n    $key_type$ key,\n    $value_type$ value) {\n  $key_null_check$\n  $value_null_check$\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .put(key, value);\n  return this;\n}\n"
    ;
    text = 
    "/**\n * Use alternate mutation accessors instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$>\n${$getMutable$capitalized_name$$}$() {\n  return internalGetMutable$capitalized_name$().getMutableMap();\n}\n"
    ;
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,text_00);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,local_38);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "private com.google.protobuf.MapField<\n"
                 "    $type_parameters$> $name$_;\n"
                 "private com.google.protobuf.MapField<$type_parameters$>\n"
                 "internalGet$capitalized_name$() {\n"
                 "  if ($name$_ == null) {\n"
                 "    return com.google.protobuf.MapField.emptyMapField(\n"
                 "        $map_field_parameter$);\n"
                 "  }\n"
                 "  return $name$_;\n"
                 "}\n"
                 "private com.google.protobuf.MapField<$type_parameters$>\n"
                 "internalGetMutable$capitalized_name$() {\n"
                 "  $on_changed$;\n"
                 "  if ($name$_ == null) {\n"
                 "    $name$_ = com.google.protobuf.MapField.newMapField(\n"
                 "        $map_field_parameter$);\n"
                 "  }\n"
                 "  if (!$name$_.isMutable()) {\n"
                 "    $name$_ = $name$_.copy();\n"
                 "  }\n"
                 "  return $name$_;\n"
                 "}\n");
  GenerateMapGetters(printer);
  printer->Print(variables_,
                 "$deprecation$\n"
                 "public Builder ${$clear$capitalized_name$$}$() {\n"
                 "  internalGetMutable$capitalized_name$().getMutableMap()\n"
                 "      .clear();\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "$deprecation$\n"
                 "public Builder ${$remove$capitalized_name$$}$(\n"
                 "    $key_type$ key) {\n"
                 "  $key_null_check$\n"
                 "  internalGetMutable$capitalized_name$().getMutableMap()\n"
                 "      .remove(key);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  if (GetJavaType(ValueField(descriptor_)) == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "/**\n"
        " * Use alternate mutation accessors instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "${$getMutable$capitalized_name$$}$() {\n"
        "  return internalGetAdapted$capitalized_name$Map(\n"
        "       internalGetMutable$capitalized_name$().getMutableMap());\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "$deprecation$public Builder ${$put$capitalized_name$$}$(\n"
                   "    $key_type$ key,\n"
                   "    $value_enum_type$ value) {\n"
                   "  $key_null_check$\n"
                   "  $value_null_check$\n"
                   "  internalGetMutable$capitalized_name$().getMutableMap()\n"
                   "      .put(key, $name$ValueConverter.doBackward(value));\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n"
        "    java.util.Map<$boxed_key_type$, $value_enum_type$> values) {\n"
        "  internalGetAdapted$capitalized_name$Map(\n"
        "      internalGetMutable$capitalized_name$().getMutableMap())\n"
        "          .putAll(values);\n"
        "  return this;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use alternate mutation accessors instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "${$getMutable$capitalized_name$Value$}$() {\n"
          "  return internalGetMutable$capitalized_name$().getMutableMap();\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "$deprecation$public Builder ${$put$capitalized_name$Value$}$(\n"
          "    $key_type$ key,\n"
          "    $value_type$ value) {\n"
          "  $key_null_check$\n"
          "  $value_null_check$\n"
          "  internalGetMutable$capitalized_name$().getMutableMap()\n"
          "      .put(key, value);\n"
          "  return this;\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "$deprecation$public Builder ${$putAll$capitalized_name$Value$}$(\n"
          "    java.util.Map<$boxed_key_type$, $boxed_value_type$> values) {\n"
          "  internalGetMutable$capitalized_name$().getMutableMap()\n"
          "      .putAll(values);\n"
          "  return this;\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }
  } else {
    printer->Print(
        variables_,
        "/**\n"
        " * Use alternate mutation accessors instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public java.util.Map<$type_parameters$>\n"
        "${$getMutable$capitalized_name$$}$() {\n"
        "  return internalGetMutable$capitalized_name$().getMutableMap();\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "$deprecation$"
                   "public Builder ${$put$capitalized_name$$}$(\n"
                   "    $key_type$ key,\n"
                   "    $value_type$ value) {\n"
                   "  $key_null_check$\n"
                   "  $value_null_check$\n"
                   "  internalGetMutable$capitalized_name$().getMutableMap()\n"
                   "      .put(key, value);\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "$deprecation$\n"
                   "public Builder ${$putAll$capitalized_name$$}$(\n"
                   "    java.util.Map<$type_parameters$> values) {\n"
                   "  internalGetMutable$capitalized_name$().getMutableMap()\n"
                   "      .putAll(values);\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
}